

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

void __thiscall
google::protobuf::util::MessageDifferencer::StreamReporter::ReportMatched
          (StreamReporter *this,Message *message1,Message *message2,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *field_path)

{
  bool bVar1;
  
  io::Printer::Print<>(this->printer_,"matched: ");
  (*(this->super_Reporter)._vptr_Reporter[9])(this,field_path,1,message1);
  bVar1 = CheckPathChanged(field_path);
  if (bVar1) {
    io::Printer::Print<>(this->printer_," -> ");
    (*(this->super_Reporter)._vptr_Reporter[9])(this,field_path,0,message2);
  }
  io::Printer::Print<>(this->printer_," : ");
  (*(this->super_Reporter)._vptr_Reporter[0xb])(this,message1,field_path,1);
  io::Printer::Print<>(this->printer_,"\n");
  return;
}

Assistant:

void MessageDifferencer::StreamReporter::ReportMatched(
    const Message& message1, const Message& message2,
    const std::vector<SpecificField>& field_path) {
  printer_->Print("matched: ");
  PrintPath(field_path, true, message1);
  if (CheckPathChanged(field_path)) {
    printer_->Print(" -> ");
    PrintPath(field_path, false, message2);
  }
  printer_->Print(" : ");
  PrintValue(message1, field_path, true);
  printer_->Print("\n");  // Print for newlines.
}